

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_tri_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  int iVar1;
  REF_DBL *pRVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL det;
  REF_DBL jac [9];
  REF_DBL xyz2 [3];
  REF_DBL xyz1 [3];
  REF_DBL xyz0 [3];
  REF_DBL area;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  double local_228 [4];
  double local_208 [4];
  double local_1e8 [4];
  double local_1c8 [6];
  REF_DBL local_198 [10];
  REF_DBL local_148 [4];
  REF_DBL local_128 [4];
  REF_DBL local_108 [4];
  double local_e8 [6];
  double local_b8 [6];
  double local_88 [6];
  double local_58 [6];
  
  if (ref_node->tri_quality == 2) {
    iVar1 = *nodes;
    pRVar2 = ref_node->real;
    lVar4 = 0;
    do {
      local_58[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    iVar1 = nodes[1];
    lVar4 = 0;
    do {
      local_88[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    iVar1 = nodes[2];
    lVar4 = 0;
    do {
      local_b8[lVar4] = pRVar2[iVar1 * 0xf + 9 + (int)lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    lVar4 = 0;
    do {
      local_1c8[lVar4] = (local_58[lVar4] + local_88[lVar4] + local_b8[lVar4]) / 3.0;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    uVar3 = ref_matrix_exp_m(local_1c8,local_e8);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_jacob_m(local_e8,local_198);
      if (uVar3 == 0) {
        uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)*nodes * 0xf,local_108);
        if (uVar3 == 0) {
          uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)nodes[1] * 0xf,local_128);
          if (uVar3 == 0) {
            uVar3 = ref_matrix_vect_mult(local_198,ref_node->real + (long)nodes[2] * 0xf,local_148);
            if (uVar3 == 0) {
              lVar4 = 0;
              do {
                local_1e8[lVar4] = local_148[lVar4] - local_128[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 3);
              lVar4 = 0;
              do {
                local_208[lVar4] = local_108[lVar4] - local_148[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 3);
              lVar4 = 0;
              do {
                local_228[lVar4] = local_128[lVar4] - local_108[lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 3);
              dVar6 = local_228[1] * local_1e8[2] - local_1e8[1] * local_228[2];
              dVar8 = local_228[2] * local_1e8[0] - local_1e8[2] * local_228[0];
              dVar7 = local_228[0] * local_1e8[1] - local_1e8[0] * local_228[1];
              dVar9 = local_228[2] * local_228[2] +
                      local_228[0] * local_228[0] + local_228[1] * local_228[1] +
                      local_208[2] * local_208[2] +
                      local_208[0] * local_208[0] + local_208[1] * local_208[1] +
                      local_1e8[2] * local_1e8[2] +
                      local_1e8[0] * local_1e8[0] + local_1e8[1] * local_1e8[1];
              dVar7 = dVar7 * dVar7 + dVar6 * dVar6 + dVar8 * dVar8;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              dVar7 = dVar7 * 0.5;
              dVar6 = dVar9 * 1e+20;
              if (dVar6 <= -dVar6) {
                dVar6 = -dVar6;
              }
              dVar8 = dVar7;
              if (dVar7 <= -dVar7) {
                dVar8 = -dVar7;
              }
              *quality = (REF_DBL)(~-(ulong)(dVar8 < dVar6) & 0xbff0000000000000 |
                                  (ulong)((dVar7 / dVar9) * 6.928203230275509) &
                                  -(ulong)(dVar8 < dVar6));
              uVar3 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x7ed,"ref_node_tri_jac_quality",(ulong)uVar3,"xyz2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x7eb,"ref_node_tri_jac_quality",(ulong)uVar3,"xyz1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x7e9,"ref_node_tri_jac_quality",(ulong)uVar3,"xyz0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x7e6,"ref_node_tri_jac_quality",(ulong)uVar3,"jac");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7e5,
             "ref_node_tri_jac_quality",(ulong)uVar3,"exp");
    }
    if (uVar3 == 0) {
      return 0;
    }
    uVar5 = 0x809;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x80c,
             "ref_node_tri_quality","case not recognized");
      return 1;
    }
    uVar3 = ref_node_ratio(ref_node,*nodes,nodes[1],local_58);
    if (uVar3 == 0) {
      uVar3 = ref_node_ratio(ref_node,*nodes,nodes[2],local_88);
      if (uVar3 == 0) {
        uVar3 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_b8);
        if (uVar3 == 0) {
          uVar3 = ref_node_tri_area(ref_node,nodes,local_e8);
          if (uVar3 == 0) {
            iVar1 = *nodes;
            pRVar2 = ref_node->real;
            lVar4 = 0;
            do {
              local_198[lVar4] = pRVar2[iVar1 * 0xf + 3 + (int)lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 6);
            uVar3 = ref_matrix_det_m(local_198,local_1c8);
            dVar7 = local_1c8[0];
            if (uVar3 == 0) {
              iVar1 = nodes[1];
              pRVar2 = ref_node->real;
              lVar4 = 0;
              do {
                local_198[lVar4] = pRVar2[iVar1 * 0xf + 3 + (int)lVar4];
                lVar4 = lVar4 + 1;
              } while (lVar4 != 6);
              uVar3 = ref_matrix_det_m(local_198,local_1c8);
              dVar6 = local_1c8[0];
              if (uVar3 == 0) {
                iVar1 = nodes[2];
                pRVar2 = ref_node->real;
                lVar4 = 0;
                do {
                  local_198[lVar4] = pRVar2[iVar1 * 0xf + 3 + (int)lVar4];
                  lVar4 = lVar4 + 1;
                } while (lVar4 != 6);
                uVar3 = ref_matrix_det_m(local_198,local_1c8);
                if (uVar3 == 0) {
                  if (dVar6 <= dVar7) {
                    dVar7 = dVar6;
                  }
                  if (local_1c8[0] <= dVar7) {
                    dVar7 = local_1c8[0];
                  }
                  dVar6 = pow(dVar7,0.3333333333333333);
                  dVar6 = dVar6 * local_e8[0];
                  dVar8 = local_b8[0] * local_b8[0] +
                          local_58[0] * local_58[0] + local_88[0] * local_88[0];
                  dVar7 = dVar8 * 1e+20;
                  if (dVar7 <= -dVar7) {
                    dVar7 = -dVar7;
                  }
                  dVar9 = dVar6;
                  if (dVar6 <= -dVar6) {
                    dVar9 = -dVar6;
                  }
                  *quality = (REF_DBL)(~-(ulong)(dVar9 < dVar7) & 0xbff0000000000000 |
                                      (ulong)((dVar6 * 6.9282032302755105) / dVar8) &
                                      -(ulong)(dVar9 < dVar7));
                  uVar3 = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x7c5,"ref_node_tri_epic_quality",(ulong)uVar3,"n2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x7c1,"ref_node_tri_epic_quality",(ulong)uVar3,"n1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x7bd,"ref_node_tri_epic_quality",(ulong)uVar3,"n0");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x7ba,"ref_node_tri_epic_quality",(ulong)uVar3,"area");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x7b8,"ref_node_tri_epic_quality",(ulong)uVar3,"l2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x7b7,"ref_node_tri_epic_quality",(ulong)uVar3,"l1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7b6,
             "ref_node_tri_epic_quality",(ulong)uVar3,"l0");
    }
    if (uVar3 == 0) {
      return 0;
    }
    uVar5 = 0x806;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
         "ref_node_tri_quality",(ulong)uVar3,"epic");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_quality(ref_node, nodes, quality), "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}